

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O1

bool __thiscall
cmListFile::ParseFile
          (cmListFile *this,char *filename,cmMessenger *messenger,cmListFileBacktrace *lfbt)

{
  bool bVar1;
  bool bVar2;
  allocator<char> local_e9;
  string local_e8;
  cmListFileParser local_c8;
  
  bVar1 = cmsys::SystemTools::FileExists(filename);
  bVar2 = true;
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,filename,&local_e9);
    bVar2 = cmsys::SystemTools::FileIsDirectory(&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar2 == false) {
    local_c8.Backtrace.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (lfbt->TopEntry).
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_c8.Backtrace.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (lfbt->TopEntry).
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    if (local_c8.Backtrace.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_c8.Backtrace.TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_c8.Backtrace.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_c8.Backtrace.TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_c8.Backtrace.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_c8.ListFile = this;
    local_c8.Messenger = messenger;
    local_c8.FileName = filename;
    local_c8.Lexer = cmListFileLexer_New();
    local_c8.Function.super_cmCommandContext.Name.Lower._M_dataplus._M_p =
         (pointer)&local_c8.Function.super_cmCommandContext.Name.Lower.field_2;
    local_c8.Function.super_cmCommandContext.Name.Lower._M_string_length = 0;
    local_c8.Function.super_cmCommandContext.Name.Lower.field_2._M_local_buf[0] = '\0';
    local_c8.Function.super_cmCommandContext.Name.Original._M_dataplus._M_p =
         (pointer)&local_c8.Function.super_cmCommandContext.Name.Original.field_2;
    local_c8.Function.super_cmCommandContext.Name.Original._M_string_length = 0;
    local_c8.Function.super_cmCommandContext.Name.Original.field_2._M_local_buf[0] = '\0';
    local_c8.Function.super_cmCommandContext.Line = 0;
    local_c8.Function.Arguments.
    super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.Function.Arguments.
    super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.Function.Arguments.
    super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar2 = cmListFileParser::ParseFile(&local_c8);
    cmListFileParser::~cmListFileParser(&local_c8);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool cmListFile::ParseFile(const char* filename, cmMessenger* messenger,
                           cmListFileBacktrace const& lfbt)
{
  if (!cmSystemTools::FileExists(filename) ||
      cmSystemTools::FileIsDirectory(filename)) {
    return false;
  }

  bool parseError = false;

  {
    cmListFileParser parser(this, lfbt, messenger, filename);
    parseError = !parser.ParseFile();
  }

  return !parseError;
}